

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Function * __thiscall Functions::returnFunction(Functions *this,Function *function)

{
  __type _Var1;
  long lVar2;
  ulong uVar3;
  string findFID;
  string stackFID;
  Function *local_90;
  _Vector_base<Function_*,_std::allocator<Function_*>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = 0;
  do {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)&local_70,&this->_functionStack);
    lVar2 = local_70._M_string_length - (long)local_70._M_dataplus._M_p;
    std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
              ((_Vector_base<Function_*,_std::allocator<Function_*>_> *)&local_70);
    if ((ulong)(lVar2 >> 3) <= uVar3) {
      return local_90;
    }
    (*(function->super_Statement)._vptr_Statement[3])(&local_70,function);
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)&local_88,&this->_functionStack);
    (*(local_88._M_impl.super__Vector_impl_data._M_start[uVar3]->super_Statement)._vptr_Statement[3]
    )(&local_50);
    std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base(&local_88);
    _Var1 = std::operator==(&local_70,&local_50);
    if (_Var1) {
      std::vector<Function_*,_std::allocator<Function_*>_>::vector
                ((vector<Function_*,_std::allocator<Function_*>_> *)&local_88,&this->_functionStack)
      ;
      local_90 = local_88._M_impl.super__Vector_impl_data._M_start[uVar3];
      std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base(&local_88);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    uVar3 = uVar3 + 1;
  } while (!_Var1);
  return local_90;
}

Assistant:

Function *Functions::returnFunction(Function *function) {
    for(int i = 0; i < getFunctionStack().size();i++){
        std::string findFID =function->id();
        std::string stackFID = getFunctionStack()[i]->id();
        if(findFID == stackFID ) {
            return getFunctionStack()[i];
        }
    }
}